

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

BPMNode * bpmnode_create(BPMLists *lists,int weight,uint index,BPMNode *tail)

{
  uint uVar1;
  BPMNode **ppBVar2;
  BPMNode **ppBVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  BPMNode *pBVar6;
  long lVar7;
  ulong uVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  long lVar12;
  
  auVar4 = _DAT_001c1cd0;
  if (lists->numfree <= lists->nextfree) {
    uVar5 = (ulong)lists->memsize;
    if (uVar5 != 0) {
      pBVar6 = lists->memory;
      lVar7 = uVar5 - 1;
      auVar9._8_4_ = (int)lVar7;
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar9 = auVar9 ^ _DAT_001c1cd0;
      auVar11 = _DAT_001c2c20;
      auVar13 = _DAT_001c2bc0;
      do {
        auVar14 = auVar13 ^ auVar4;
        iVar10 = auVar9._4_4_;
        if ((bool)(~(auVar14._4_4_ == iVar10 && auVar9._0_4_ < auVar14._0_4_ ||
                    iVar10 < auVar14._4_4_) & 1)) {
          *(undefined4 *)((long)&pBVar6->in_use + lVar7) = 0;
        }
        if ((auVar14._12_4_ != auVar9._12_4_ || auVar14._8_4_ <= auVar9._8_4_) &&
            auVar14._12_4_ <= auVar9._12_4_) {
          *(undefined4 *)((long)&pBVar6[1].in_use + lVar7) = 0;
        }
        auVar14 = auVar11 ^ auVar4;
        iVar15 = auVar14._4_4_;
        if (iVar15 <= iVar10 && (iVar15 != iVar10 || auVar14._0_4_ <= auVar9._0_4_)) {
          *(undefined4 *)((long)&pBVar6[2].in_use + lVar7) = 0;
          *(undefined4 *)((long)&pBVar6[3].in_use + lVar7) = 0;
        }
        lVar12 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 4;
        auVar13._8_8_ = lVar12 + 4;
        lVar12 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 4;
        auVar11._8_8_ = lVar12 + 4;
        lVar7 = lVar7 + 0x60;
      } while ((uVar5 * 8 + 0x18 & 0xffffffffffffffe0) * 3 != lVar7);
    }
    uVar1 = lists->listsize;
    if ((ulong)uVar1 != 0) {
      ppBVar2 = lists->chains0;
      ppBVar3 = lists->chains1;
      uVar8 = 0;
      do {
        for (pBVar6 = ppBVar2[uVar8]; pBVar6 != (BPMNode *)0x0; pBVar6 = pBVar6->tail) {
          pBVar6->in_use = 1;
        }
        for (pBVar6 = ppBVar3[uVar8]; pBVar6 != (BPMNode *)0x0; pBVar6 = pBVar6->tail) {
          pBVar6->in_use = 1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar1);
    }
    lists->numfree = 0;
    if (uVar5 != 0) {
      lVar7 = 0;
      do {
        if (*(int *)((long)&lists->memory->in_use + lVar7) == 0) {
          uVar1 = lists->numfree;
          lists->numfree = uVar1 + 1;
          lists->freelist[uVar1] = (BPMNode *)((long)&lists->memory->weight + lVar7);
        }
        lVar7 = lVar7 + 0x18;
      } while (uVar5 * 0x18 != lVar7);
    }
    lists->nextfree = 0;
  }
  uVar1 = lists->nextfree;
  lists->nextfree = uVar1 + 1;
  pBVar6 = lists->freelist[uVar1];
  pBVar6->weight = weight;
  pBVar6->index = index;
  pBVar6->tail = tail;
  return pBVar6;
}

Assistant:

static BPMNode* bpmnode_create(BPMLists* lists, int weight, unsigned index, BPMNode* tail)
{
  unsigned i;
  BPMNode* result;

  /*memory full, so garbage collect*/
  if(lists->nextfree >= lists->numfree)
  {
    /*mark only those that are in use*/
    for(i = 0; i != lists->memsize; ++i) lists->memory[i].in_use = 0;
    for(i = 0; i != lists->listsize; ++i)
    {
      BPMNode* node;
      for(node = lists->chains0[i]; node != 0; node = node->tail) node->in_use = 1;
      for(node = lists->chains1[i]; node != 0; node = node->tail) node->in_use = 1;
    }
    /*collect those that are free*/
    lists->numfree = 0;
    for(i = 0; i != lists->memsize; ++i)
    {
      if(!lists->memory[i].in_use) lists->freelist[lists->numfree++] = &lists->memory[i];
    }
    lists->nextfree = 0;
  }

  result = lists->freelist[lists->nextfree++];
  result->weight = weight;
  result->index = index;
  result->tail = tail;
  return result;
}